

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::LookAt
          (FormattingScene *this,Float ex,Float ey,Float ez,Float lx,Float ly,Float lz,Float ux,
          Float uy,Float uz,FileLoc loc)

{
  float *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  float *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  float *in_stack_00000010;
  float *in_stack_00000018;
  float *in_stack_00000020;
  undefined8 in_stack_ffffffffffffff40;
  int extra;
  FormattingScene *in_stack_ffffffffffffff48;
  string local_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  extra = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  indent_abi_cxx11_(in_stack_ffffffffffffff48,extra);
  indent_abi_cxx11_(in_stack_ffffffffffffff48,extra);
  indent_abi_cxx11_(in_stack_ffffffffffffff48,extra);
  Printf<std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_RDI,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void FormattingScene::LookAt(Float ex, Float ey, Float ez, Float lx, Float ly, Float lz,
                             Float ux, Float uy, Float uz, FileLoc loc) {
    Printf("%sLookAt %f %f %f\n%s    %f %f %f\n%s    %f %f %f\n", indent(), ex, ey, ez,
           indent(), lx, ly, lz, indent(), ux, uy, uz);
}